

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Performance::anon_unknown_1::
RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::init
          (RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>
           *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int extraout_EAX;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  RenderTarget *pRVar3;
  NotSupportedError *this_00;
  reference pvVar4;
  size_type sVar5;
  value_type local_1a0;
  int local_14c;
  int local_148;
  int gridNdx;
  int gridSizes [19];
  int local_f4;
  string local_f0;
  int local_bc;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  long local_18;
  Functions *gl;
  RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration> *this_local;
  
  gl = (Functions *)this;
  pRVar2 = gles3::Context::getRenderContext
                     ((this->super_RenderPerformanceTestBase).super_TestCase.m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  local_18 = CONCAT44(extraout_var,iVar1);
  RenderPerformanceTestBase::init(&this->super_RenderPerformanceTestBase,ctx);
  pRVar3 = gles3::Context::getRenderTarget
                     ((this->super_RenderPerformanceTestBase).super_TestCase.m_context);
  iVar1 = tcu::RenderTarget::getWidth(pRVar3);
  if (0x7f < iVar1) {
    pRVar3 = gles3::Context::getRenderTarget
                       ((this->super_RenderPerformanceTestBase).super_TestCase.m_context);
    iVar1 = tcu::RenderTarget::getHeight(pRVar3);
    if (0x7f < iVar1) {
      (**(code **)(local_18 + 0x1a00))(0,0,0x80);
      (**(code **)(local_18 + 0x120))(0x302,0x303);
      (**(code **)(local_18 + 0x100))(0x8006);
      (**(code **)(local_18 + 0x5e0))(0xbe2);
      memcpy(&local_148,&DAT_02bdc170,0x4c);
      for (local_14c = 0; local_14c < 0x13; local_14c = local_14c + 1) {
        memset(&local_1a0,0,0x50);
        std::
        vector<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult>_>
        ::push_back(&this->m_results,&local_1a0);
        iVar1 = (&local_148)[local_14c];
        pvVar4 = std::
                 vector<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult>_>
                 ::back(&this->m_results);
        (pvVar4->scene).gridHeight = iVar1;
        iVar1 = (&local_148)[local_14c];
        pvVar4 = std::
                 vector<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult>_>
                 ::back(&this->m_results);
        (pvVar4->scene).gridWidth = iVar1;
        pvVar4 = std::
                 vector<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult>_>
                 ::back(&this->m_results);
        (pvVar4->scene).gridLayers = 5;
        pvVar4 = std::
                 vector<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult>_>
                 ::back(&this->m_results);
        iVar1 = getLayeredGridNumVertices(&pvVar4->scene);
        pvVar4 = std::
                 vector<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult>_>
                 ::back(&this->m_results);
        (pvVar4->result).numVertices = iVar1;
        pvVar4 = std::
                 vector<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult>_>
                 ::back(&this->m_results);
        (pvVar4->result).renderDataSize = -1;
        pvVar4 = std::
                 vector<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult>_>
                 ::back(&this->m_results);
        (pvVar4->result).uploadedDataSize = -1;
        pvVar4 = std::
                 vector<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult>_>
                 ::back(&this->m_results);
        (pvVar4->result).unrelatedDataSize = -1;
      }
      sVar5 = std::
              vector<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::UploadRenderReadDuration>::SampleResult>_>
              ::size(&this->m_results);
      std::vector<int,_std::allocator<int>_>::resize(&this->m_iterationOrder,sVar5);
      sVar5 = std::vector<int,_std::allocator<int>_>::size(&this->m_iterationOrder);
      generateTwoPassRandomIterationOrder(&this->m_iterationOrder,(int)sVar5);
      return extraout_EAX;
    }
  }
  gridSizes[0x12]._3_1_ = 1;
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_bc = 0x80;
  de::toString<int>(&local_b8,&local_bc);
  std::operator+(&local_98,"Test case requires ",&local_b8);
  std::operator+(&local_78,&local_98,"x");
  local_f4 = 0x80;
  de::toString<int>(&local_f0,&local_f4);
  std::operator+(&local_58,&local_78,&local_f0);
  std::operator+(&local_38,&local_58," render target");
  tcu::NotSupportedError::NotSupportedError(this_00,&local_38);
  gridSizes[0x12]._3_1_ = 0;
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void RenderCase<SampleType>::init (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	RenderPerformanceTestBase::init();

	// requirements

	if (m_context.getRenderTarget().getWidth() < RENDER_AREA_SIZE ||
		m_context.getRenderTarget().getHeight() < RENDER_AREA_SIZE)
		throw tcu::NotSupportedError("Test case requires " + de::toString<int>(RENDER_AREA_SIZE) + "x" + de::toString<int>(RENDER_AREA_SIZE) + " render target");

	// gl state

	gl.viewport(0, 0, RENDER_AREA_SIZE, RENDER_AREA_SIZE);

	// enable bleding to prevent grid layers from being discarded
	gl.blendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
	gl.blendEquation(GL_FUNC_ADD);
	gl.enable(GL_BLEND);

	// generate iterations

	{
		const int gridSizes[] = { 20, 26, 32, 38, 44, 50, 56, 62, 68, 74, 80,  86,  92,  98,  104, 110, 116, 122, 128 };

		for (int gridNdx = 0; gridNdx < DE_LENGTH_OF_ARRAY(gridSizes); ++gridNdx)
		{
			m_results.push_back(SampleResult());

			m_results.back().scene.gridHeight = gridSizes[gridNdx];
			m_results.back().scene.gridWidth = gridSizes[gridNdx];
			m_results.back().scene.gridLayers = 5;

			m_results.back().result.numVertices = getLayeredGridNumVertices(m_results.back().scene);

			// test cases set these, initialize to dummy values
			m_results.back().result.renderDataSize = -1;
			m_results.back().result.uploadedDataSize = -1;
			m_results.back().result.unrelatedDataSize = -1;
		}
	}

	// randomize iteration order
	{
		m_iterationOrder.resize(m_results.size());
		generateTwoPassRandomIterationOrder(m_iterationOrder, (int)m_iterationOrder.size());
	}
}